

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O1

bool from_issue_145::
     test_uintwide_t_spot_values_from_issue_145<math::wide_integer::uintwide_t<128u,unsigned_int,void,false>>
               (uintwide_t<128U,_unsigned_int,_void,_false> *x)

{
  uint *puVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  unsigned_fast_type i;
  long lVar5;
  uintwide_t<128U,_unsigned_int,_void,_false> *puVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  local_unknown_integer_type a;
  uintwide_t<128U,_unsigned_int,_void,_false> self;
  uint local_38 [4];
  uintwide_t<128U,_unsigned_int,_void,_false> local_28;
  
  uVar3 = *(undefined8 *)(x->values).super_array<unsigned_int,_4UL>.elems;
  uVar4 = *(undefined8 *)((x->values).super_array<unsigned_int,_4UL>.elems + 2);
  local_38[0] = (uint)uVar3;
  local_38[1] = (uint)((ulong)uVar3 >> 0x20);
  local_38[2] = (uint)uVar4;
  local_38[3] = (uint)((ulong)uVar4 >> 0x20);
  local_28.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
       *(undefined8 *)(x->values).super_array<unsigned_int,_4UL>.elems;
  local_28.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
       *(undefined8 *)((x->values).super_array<unsigned_int,_4UL>.elems + 2);
  lVar5 = 0;
  uVar7 = 0;
  do {
    uVar7 = (ulong)local_28.values.super_array<unsigned_int,_4UL>.elems[lVar5] +
            local_38[lVar5] + uVar7;
    local_38[lVar5] = (uint)uVar7;
    uVar7 = uVar7 >> 0x20;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_28.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_28.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  local_28.values.super_array<unsigned_int,_4UL>.elems[0] = 2;
  local_28.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  puVar6 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator*=(&local_28,x);
  local_28.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
       *(undefined8 *)(puVar6->values).super_array<unsigned_int,_4UL>.elems;
  local_28.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
       *(undefined8 *)((puVar6->values).super_array<unsigned_int,_4UL>.elems + 2);
  lVar5 = 0xc;
  do {
    bVar8 = 0;
    if (lVar5 == -4) break;
    puVar1 = (uint *)((long)local_38 + lVar5);
    uVar2 = *(uint *)((long)local_28.values.super_array<unsigned_int,_4UL>.elems + lVar5);
    bVar8 = -(*puVar1 <= uVar2) | 1;
    lVar5 = lVar5 + -4;
  } while (*puVar1 == uVar2);
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_28.values.super_array<unsigned_int,_4UL>.elems[0] = 0;
  local_28.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_28.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_28.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  lVar5 = 0xc;
  do {
    bVar9 = 0;
    if (lVar5 == -4) break;
    puVar1 = (uint *)((long)local_38 + lVar5);
    uVar2 = *(uint *)((long)local_28.values.super_array<unsigned_int,_4UL>.elems + lVar5);
    bVar9 = -(*puVar1 <= uVar2) | 1;
    lVar5 = lVar5 + -4;
  } while (*puVar1 == uVar2);
  local_38[0] = 1;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_28.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_28.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  local_28.values.super_array<unsigned_int,_4UL>.elems[0] = 1;
  local_28.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  lVar5 = 0xc;
  do {
    bVar10 = 0;
    if (lVar5 == -4) break;
    puVar1 = (uint *)((long)local_38 + lVar5);
    uVar2 = *(uint *)((long)local_28.values.super_array<unsigned_int,_4UL>.elems + lVar5);
    bVar10 = -(*puVar1 <= uVar2) | 1;
    lVar5 = lVar5 + -4;
  } while (*puVar1 == uVar2);
  return (bVar9 == 0 && bVar8 == 0) && bVar10 == 0;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_145(const UnknownIntegerType& x) -> bool
  {
    // See also https://github.com/ckormanyos/wide-integer/issues/145#issuecomment-1006374713

    using local_unknown_integer_type = UnknownIntegerType;

    bool local_result_is_ok = true;

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wself-assign-overloaded"
    #endif

    {
      local_unknown_integer_type a = x; a += a; // NOLINT(clang-diagnostic-self-assign-overloaded)

      local_result_is_ok = ((a == (2U * x)) && local_result_is_ok);
    }

    {
      local_unknown_integer_type a = x; a -= a; // NOLINT(clang-diagnostic-self-assign-overloaded)

      local_result_is_ok = ((a == 0U) && local_result_is_ok);
    }

    {
      local_unknown_integer_type a = x; a /= a; // NOLINT(clang-diagnostic-self-assign-overloaded)

      local_result_is_ok = ((a == 1U) && local_result_is_ok);
    }

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic pop
    #endif

    return local_result_is_ok;
  }